

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O2

void __thiscall OpenMD::PairList::removePair(PairList *this,int i,int j)

{
  ulong uVar1;
  iterator __position;
  ulong uVar2;
  key_type local_10;
  
  if (i != j) {
    uVar1 = (ulong)(uint)j;
    if (j < i) {
      uVar1 = (ulong)(uint)i;
    }
    uVar2 = (ulong)(uint)j;
    if (i < j) {
      uVar2 = (ulong)(uint)i;
    }
    local_10 = (key_type)(uVar2 | uVar1 << 0x20);
    __position = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::find((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                         *)this,&local_10);
    if ((_Rb_tree_header *)__position._M_node !=
        &(this->pairSet_)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                          *)this,(const_iterator)__position._M_node);
      this->modified_ = true;
    }
  }
  return;
}

Assistant:

void PairList::removePair(int i, int j) {
    if (i == j) {
      return;
    } else if (i > j) {
      std::swap(i, j);
    }

    std::set<std::pair<int, int>>::iterator iter =
        pairSet_.find(std::make_pair(i, j));

    if (iter != pairSet_.end()) {
      pairSet_.erase(iter);
      modified_ = true;
    }
  }